

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O2

InputSource * __thiscall
xercesc_4_0::DGXMLScanner::resolveSystemId(DGXMLScanner *this,XMLCh *sysId,XMLCh *pubId)

{
  XMLBufferMgr *this_00;
  ReaderMgr *this_01;
  XMLCh *pXVar1;
  XMLEntityHandler *pXVar2;
  bool bVar3;
  int iVar4;
  XMLBuffer *pXVar5;
  undefined4 extraout_var;
  XMLBuffer *normalizedURI;
  URLInputSource *this_02;
  MalformedURLException *this_03;
  XMLBufBid ddSys;
  XMLBufBid bbSys;
  XMLBufBid nnSys;
  LastExtEntityInfo lastInfo;
  XMLResourceIdentifier resourceIdentifier;
  
  this_00 = &(this->super_XMLScanner).fBufMgr;
  pXVar5 = XMLBufferMgr::bidOnBuffer(this_00);
  resourceIdentifier.fResourceIdentifierType =
       CONCAT22(resourceIdentifier.fResourceIdentifierType._2_2_,0xffff);
  nnSys.fBuffer = pXVar5;
  nnSys.fMgr = this_00;
  XMLString::removeChar(sysId,(XMLCh *)&resourceIdentifier,pXVar5);
  pXVar1 = pXVar5->fBuffer;
  pXVar1[pXVar5->fIndex] = L'\0';
  pXVar5 = XMLBufferMgr::bidOnBuffer(this_00);
  pXVar2 = (this->super_XMLScanner).fEntityHandler;
  bbSys.fBuffer = pXVar5;
  bbSys.fMgr = this_00;
  if (pXVar2 == (XMLEntityHandler *)0x0) {
    XMLBuffer::set(pXVar5,pXVar1);
  }
  else {
    iVar4 = (*pXVar2->_vptr_XMLEntityHandler[3])(pXVar2,pXVar1,pXVar5);
    if ((char)iVar4 == '\0') {
      XMLBuffer::set(pXVar5,pXVar1);
    }
    this_01 = &(this->super_XMLScanner).fReaderMgr;
    ReaderMgr::getLastExtEntityInfo(this_01,&lastInfo);
    resourceIdentifier.fSystemId = pXVar5->fBuffer;
    resourceIdentifier.fSystemId[pXVar5->fIndex] = L'\0';
    resourceIdentifier.fResourceIdentifierType = ExternalEntity;
    resourceIdentifier.fBaseURI = lastInfo.systemId;
    resourceIdentifier.fNameSpace = (XMLCh *)0x0;
    resourceIdentifier.fPublicId = pubId;
    resourceIdentifier.fLocator = &this_01->super_Locator;
    iVar4 = (*((this->super_XMLScanner).fEntityHandler)->_vptr_XMLEntityHandler[5])();
    this_02 = (URLInputSource *)CONCAT44(extraout_var,iVar4);
    if (this_02 != (URLInputSource *)0x0) goto LAB_002a153a;
  }
  if ((this->super_XMLScanner).fDisableDefaultEntityResolution == false) {
    ReaderMgr::getLastExtEntityInfo(&(this->super_XMLScanner).fReaderMgr,&lastInfo);
    XMLURL::XMLURL((XMLURL *)&resourceIdentifier,(this->super_XMLScanner).fMemoryManager);
    pXVar1 = pXVar5->fBuffer;
    pXVar1[pXVar5->fIndex] = L'\0';
    bVar3 = XMLURL::setURL((XMLURL *)&resourceIdentifier,lastInfo.systemId,pXVar1,
                           (XMLURL *)&resourceIdentifier);
    if ((!bVar3) || (bVar3 = XMLURL::isRelative((XMLURL *)&resourceIdentifier), bVar3)) {
      if ((this->super_XMLScanner).fStandardUriConformant != false) {
        this_03 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (this_03,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                   ,0xabc,URL_MalformedURL,(this->super_XMLScanner).fMemoryManager);
        goto LAB_002a158b;
      }
      normalizedURI = XMLBufferMgr::bidOnBuffer(this_00);
      pXVar1 = pXVar5->fBuffer;
      pXVar1[pXVar5->fIndex] = L'\0';
      ddSys.fBuffer = normalizedURI;
      ddSys.fMgr = this_00;
      XMLUri::normalizeURI(pXVar1,normalizedURI);
      this_02 = (URLInputSource *)
                XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
      pXVar1 = normalizedURI->fBuffer;
      pXVar1[normalizedURI->fIndex] = L'\0';
      LocalFileInputSource::LocalFileInputSource
                ((LocalFileInputSource *)this_02,lastInfo.systemId,pXVar1,
                 (this->super_XMLScanner).fMemoryManager);
      XMLBufBid::~XMLBufBid(&ddSys);
    }
    else {
      if (((this->super_XMLScanner).fStandardUriConformant == true) &&
         (bVar3 = XMLURL::hasInvalidChar((XMLURL *)&resourceIdentifier), bVar3)) {
        this_03 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (this_03,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                   ,0xac1,URL_MalformedURL,(this->super_XMLScanner).fMemoryManager);
LAB_002a158b:
        __cxa_throw(this_03,&MalformedURLException::typeinfo,XMLException::~XMLException);
      }
      this_02 = (URLInputSource *)
                XMemory::operator_new(0x88,(this->super_XMLScanner).fMemoryManager);
      URLInputSource::URLInputSource
                (this_02,(XMLURL *)&resourceIdentifier,(this->super_XMLScanner).fMemoryManager);
    }
    XMLURL::~XMLURL((XMLURL *)&resourceIdentifier);
  }
  else {
    this_02 = (URLInputSource *)0x0;
  }
LAB_002a153a:
  XMLBufBid::~XMLBufBid(&bbSys);
  XMLBufBid::~XMLBufBid(&nnSys);
  return &this_02->super_InputSource;
}

Assistant:

InputSource* DGXMLScanner::resolveSystemId(const XMLCh* const sysId
                                          ,const XMLCh* const pubId)
{
    //Normalize sysId
    XMLBufBid nnSys(&fBufMgr);
    XMLBuffer& normalizedSysId = nnSys.getBuffer();
    XMLString::removeChar(sysId, 0xFFFF, normalizedSysId);
    const XMLCh* normalizedURI = normalizedSysId.getRawBuffer();

    // Create a buffer for expanding the normalized system id
    XMLBufBid bbSys(&fBufMgr);
    XMLBuffer& expSysId = bbSys.getBuffer();

    //  Allow the entity handler to expand the system id if they choose
    //  to do so.
    InputSource* srcToFill = 0;
    if (fEntityHandler)
    {
        if (!fEntityHandler->expandSystemId(normalizedURI, expSysId))
            expSysId.set(normalizedURI);

        ReaderMgr::LastExtEntityInfo lastInfo;
        fReaderMgr.getLastExtEntityInfo(lastInfo);
        XMLResourceIdentifier resourceIdentifier(XMLResourceIdentifier::ExternalEntity,
                            expSysId.getRawBuffer(), 0, pubId, lastInfo.systemId,
                            &fReaderMgr);
        srcToFill = fEntityHandler->resolveEntity(&resourceIdentifier);
    }
    else
    {
        expSysId.set(normalizedURI);
    }

    //  If they didn't create a source via the entity handler, then we
    //  have to create one on our own.
    if (!srcToFill)
    {
        if (fDisableDefaultEntityResolution)
            return srcToFill;

        ReaderMgr::LastExtEntityInfo lastInfo;
        fReaderMgr.getLastExtEntityInfo(lastInfo);

        XMLURL urlTmp(fMemoryManager);
        if ((!urlTmp.setURL(lastInfo.systemId, expSysId.getRawBuffer(), urlTmp)) ||
            (urlTmp.isRelative()))
        {
            if (!fStandardUriConformant)
            {
                XMLBufBid  ddSys(&fBufMgr);
                XMLBuffer& resolvedSysId = ddSys.getBuffer();
                XMLUri::normalizeURI(expSysId.getRawBuffer(), resolvedSysId);

                srcToFill = new (fMemoryManager) LocalFileInputSource
                (
                    lastInfo.systemId
                    , resolvedSysId.getRawBuffer()
                    , fMemoryManager
                );
            }
            else
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
        }
        else
        {
            if (fStandardUriConformant && urlTmp.hasInvalidChar())
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
            srcToFill = new (fMemoryManager) URLInputSource(urlTmp, fMemoryManager);
        }
    }

    return srcToFill;
}